

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_doors.cpp
# Opt level: O3

void __thiscall
DDoor::DDoor(DDoor *this,sector_t *sec,EVlDoor type,double speed,int delay,int lightTag,
            int topcountdown)

{
  sector_t *psVar1;
  DObject *pDVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  bool bVar6;
  double dVar7;
  double dVar8;
  vertex_t *spot;
  vertex_t *local_40;
  double local_38;
  PClass *pPVar5;
  
  local_38 = speed;
  DMovingCeiling::DMovingCeiling(&this->super_DMovingCeiling,sec,true);
  (this->super_DMovingCeiling).super_DMover.super_DSectorEffect.super_DThinker.super_DObject.
  _vptr_DObject = (_func_int **)&PTR_StaticType_00870e20;
  this->m_Type = type;
  this->m_Speed = local_38;
  this->m_TopWait = delay;
  this->m_TopCountdown = topcountdown;
  this->m_LightTag = lightTag;
  if ((i_compatflags._1_1_ & 2) != 0) {
    this->m_LightTag = 0;
  }
  switch(type) {
  case doorClose:
    this->m_Direction = -1;
    dVar7 = sector_t::FindLowestCeilingSurrounding(sec,&local_40);
    this->m_TopDist =
         -((dVar7 + -4.0) * (sec->ceilingplane).normal.Z +
          (sec->ceilingplane).normal.X * (local_40->p).X +
          (local_40->p).Y * (sec->ceilingplane).normal.Y);
    break;
  case doorOpen:
  case doorRaise:
    this->m_Direction = 1;
    dVar7 = sector_t::FindLowestCeilingSurrounding(sec,&local_40);
    dVar8 = -((dVar7 + -4.0) * (sec->ceilingplane).normal.Z +
             (sec->ceilingplane).normal.X * (local_40->p).X +
             (local_40->p).Y * (sec->ceilingplane).normal.Y);
    this->m_TopDist = dVar8;
    dVar7 = (sec->ceilingplane).D;
    bVar6 = true;
    if ((dVar7 == dVar8) && (!NAN(dVar7) && !NAN(dVar8))) goto switchD_0051a949_default;
    goto LAB_0051ab13;
  case doorWaitRaise:
    this->m_Direction = 2;
    dVar7 = sector_t::FindLowestCeilingSurrounding(sec,&local_40);
    dVar7 = -((dVar7 + -4.0) * (sec->ceilingplane).normal.Z +
             (sec->ceilingplane).normal.X * (local_40->p).X +
             (local_40->p).Y * (sec->ceilingplane).normal.Y);
    goto LAB_0051aaf5;
  case doorCloseWaitOpen:
    this->m_TopDist = (sec->ceilingplane).D;
    this->m_Direction = -1;
    break;
  case doorWaitClose:
    this->m_Direction = 0;
    this->m_Type = doorRaise;
    dVar7 = sector_t::FindHighestFloorPoint(sec,&this->m_BotSpot);
    this->m_BotDist =
         -(dVar7 * (sec->ceilingplane).normal.Z +
          (sec->ceilingplane).normal.Y * (this->m_BotSpot->p).Y +
          (sec->ceilingplane).normal.X * (this->m_BotSpot->p).X);
    this->m_OldFloorDist = (sec->floorplane).D;
    dVar7 = (sec->ceilingplane).D;
LAB_0051aaf5:
    this->m_TopDist = dVar7;
  default:
    goto switchD_0051a949_default;
  }
  bVar6 = false;
LAB_0051ab13:
  DoorSound(this,bVar6,(DSeqNode *)0x0);
switchD_0051a949_default:
  pPVar3 = DPlat::RegistrationInfo.MyClass;
  psVar1 = (this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector;
  pDVar2 = (psVar1->floordata).field_0.o;
  if (pDVar2 != (DObject *)0x0) {
    if ((pDVar2->ObjectFlags & 0x20) == 0) {
      pPVar5 = pDVar2->Class;
      if (pPVar5 == (PClass *)0x0) {
        iVar4 = (**pDVar2->_vptr_DObject)(pDVar2);
        pPVar5 = (PClass *)CONCAT44(extraout_var,iVar4);
        pDVar2->Class = pPVar5;
      }
      bVar6 = pPVar5 != (PClass *)0x0;
      if (pPVar5 != pPVar3 && bVar6) {
        do {
          pPVar5 = pPVar5->ParentClass;
          bVar6 = pPVar5 != (PClass *)0x0;
          if (pPVar5 == pPVar3) break;
        } while (pPVar5 != (PClass *)0x0);
      }
      if ((bVar6) &&
         (*(int *)&(((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector)->
                   floordata).field_0.p[1].m_Sector - 1U < 2)) {
        dVar7 = sector_t::FindLowestCeilingPoint(sec,&this->m_BotSpot);
        goto LAB_0051abc4;
      }
    }
    else {
      (psVar1->floordata).field_0.p = (DSectorEffect *)0x0;
    }
  }
  dVar7 = sector_t::FindHighestFloorPoint(sec,&this->m_BotSpot);
LAB_0051abc4:
  this->m_BotDist =
       -(dVar7 * (sec->ceilingplane).normal.Z +
        (sec->ceilingplane).normal.Y * (this->m_BotSpot->p).Y +
        (sec->ceilingplane).normal.X * (this->m_BotSpot->p).X);
  this->m_OldFloorDist = (sec->floorplane).D;
  return;
}

Assistant:

DDoor::DDoor (sector_t *sec, EVlDoor type, double speed, int delay, int lightTag, int topcountdown)
	: DMovingCeiling (sec),
  	  m_Type (type), m_Speed (speed), m_TopWait (delay), m_TopCountdown(topcountdown), m_LightTag (lightTag)
{
	vertex_t *spot;
	double height;

	if (i_compatflags & COMPATF_NODOORLIGHT)
	{
		m_LightTag = 0;
	}

	switch (type)
	{
	case doorClose:
		m_Direction = -1;
		height = sec->FindLowestCeilingSurrounding (&spot);
		m_TopDist = sec->ceilingplane.PointToDist (spot, height - 4);
		DoorSound (false);
		break;

	case doorOpen:
	case doorRaise:
		m_Direction = 1;
		height = sec->FindLowestCeilingSurrounding (&spot);
		m_TopDist = sec->ceilingplane.PointToDist (spot, height - 4);
		if (m_TopDist != sec->ceilingplane.fD())
			DoorSound (true);
		break;

	case doorCloseWaitOpen:
		m_TopDist = sec->ceilingplane.fD();
		m_Direction = -1;
		DoorSound (false);
		break;

	case doorWaitRaise:
		m_Direction = 2;
		height = sec->FindLowestCeilingSurrounding (&spot);
		m_TopDist = sec->ceilingplane.PointToDist (spot, height - 4);
		break;

	case doorWaitClose:
		m_Direction = 0;
		m_Type = DDoor::doorRaise;
		height = sec->FindHighestFloorPoint (&m_BotSpot);
		m_BotDist = sec->ceilingplane.PointToDist (m_BotSpot, height);
		m_OldFloorDist = sec->floorplane.fD();
		m_TopDist = sec->ceilingplane.fD();
		break;

	}

	if (!m_Sector->floordata || !m_Sector->floordata->IsKindOf(RUNTIME_CLASS(DPlat)) ||
		!(barrier_cast<DPlat*>(m_Sector->floordata))->IsLift())
	{
		height = sec->FindHighestFloorPoint (&m_BotSpot);
		m_BotDist = sec->ceilingplane.PointToDist (m_BotSpot, height);
	}
	else
	{
		height = sec->FindLowestCeilingPoint(&m_BotSpot);
		m_BotDist = sec->ceilingplane.PointToDist (m_BotSpot, height);
	}
	m_OldFloorDist = sec->floorplane.fD();
}